

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ans_msb.hpp
# Opt level: O3

ans_msb_decode * ans_msb_decode::load(ans_msb_decode *__return_storage_ptr__,uint8_t *in_u8)

{
  uint uVar1;
  pointer puVar2;
  pointer pdVar3;
  bool bVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined8 uVar7;
  byte bVar8;
  byte bVar9;
  int iVar10;
  uint64_t uVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  int iVar15;
  int iVar16;
  uint uVar17;
  int iVar18;
  uint uVar19;
  ushort uVar20;
  undefined1 auVar21 [32];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 extraout_var [56];
  undefined1 auVar27 [64];
  undefined1 in_XMM7 [16];
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_38;
  
  (__return_storage_ptr__->nfreqs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->nfreqs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->nfreqs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->table).super__Vector_base<dec_entry_msb,_std::allocator<dec_entry_msb>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->table).super__Vector_base<dec_entry_msb,_std::allocator<dec_entry_msb>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->table).super__Vector_base<dec_entry_msb,_std::allocator<dec_entry_msb>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ans_load_interp(&local_38,in_u8);
  (__return_storage_ptr__->nfreqs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_start =
       local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_start;
  (__return_storage_ptr__->nfreqs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->nfreqs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  if (local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start ==
      local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    uVar11 = 0;
  }
  else {
    auVar22 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar23 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar27 = ZEXT1664((undefined1  [16])0x0);
    uVar13 = 0;
    auVar24 = vpbroadcastq_avx512f();
    auVar24 = vpsrlq_avx512f(auVar24,2);
    do {
      auVar25 = vpbroadcastq_avx512f();
      auVar26 = vmovdqa64_avx512f(auVar27);
      auVar27 = vporq_avx512f(auVar25,auVar22);
      auVar25 = vporq_avx512f(auVar25,auVar23);
      uVar7 = vpcmpuq_avx512f(auVar25,auVar24,2);
      bVar8 = (byte)uVar7;
      uVar7 = vpcmpuq_avx512f(auVar27,auVar24,2);
      bVar9 = (byte)uVar7;
      uVar20 = CONCAT11(bVar9,bVar8);
      auVar27 = vmovdqu32_avx512f(*(undefined1 (*) [64])
                                   (local_38.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start + uVar13));
      auVar25._4_4_ = (uint)((byte)(uVar20 >> 1) & 1) * auVar27._4_4_;
      auVar25._0_4_ = (uint)(bVar8 & 1) * auVar27._0_4_;
      auVar25._8_4_ = (uint)((byte)(uVar20 >> 2) & 1) * auVar27._8_4_;
      auVar25._12_4_ = (uint)((byte)(uVar20 >> 3) & 1) * auVar27._12_4_;
      auVar25._16_4_ = (uint)((byte)(uVar20 >> 4) & 1) * auVar27._16_4_;
      auVar25._20_4_ = (uint)((byte)(uVar20 >> 5) & 1) * auVar27._20_4_;
      auVar25._24_4_ = (uint)((byte)(uVar20 >> 6) & 1) * auVar27._24_4_;
      auVar25._28_4_ = (uint)((byte)(uVar20 >> 7) & 1) * auVar27._28_4_;
      auVar25._32_4_ = (uint)(bVar9 & 1) * auVar27._32_4_;
      auVar25._36_4_ = (uint)(bVar9 >> 1 & 1) * auVar27._36_4_;
      auVar25._40_4_ = (uint)(bVar9 >> 2 & 1) * auVar27._40_4_;
      auVar25._44_4_ = (uint)(bVar9 >> 3 & 1) * auVar27._44_4_;
      auVar25._48_4_ = (uint)(bVar9 >> 4 & 1) * auVar27._48_4_;
      auVar25._52_4_ = (uint)(bVar9 >> 5 & 1) * auVar27._52_4_;
      auVar25._56_4_ = (uint)(bVar9 >> 6 & 1) * auVar27._56_4_;
      auVar25._60_4_ = (uint)(bVar9 >> 7) * auVar27._60_4_;
      uVar13 = uVar13 + 0x10;
      auVar27 = vpaddd_avx512f(auVar25,auVar26);
    } while ((((ulong)((long)local_38.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_finish +
                      (-4 - (long)local_38.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start)) >> 2) + 0x10 &
             0xfffffffffffffff0) != uVar13);
    auVar22 = vmovdqa32_avx512f(auVar27);
    auVar23._0_4_ = (uint)(bVar8 & 1) * auVar22._0_4_ | (uint)!(bool)(bVar8 & 1) * auVar26._0_4_;
    bVar4 = (bool)((byte)(uVar20 >> 1) & 1);
    auVar23._4_4_ = (uint)bVar4 * auVar22._4_4_ | (uint)!bVar4 * auVar26._4_4_;
    bVar4 = (bool)((byte)(uVar20 >> 2) & 1);
    auVar23._8_4_ = (uint)bVar4 * auVar22._8_4_ | (uint)!bVar4 * auVar26._8_4_;
    bVar4 = (bool)((byte)(uVar20 >> 3) & 1);
    auVar23._12_4_ = (uint)bVar4 * auVar22._12_4_ | (uint)!bVar4 * auVar26._12_4_;
    bVar4 = (bool)((byte)(uVar20 >> 4) & 1);
    auVar23._16_4_ = (uint)bVar4 * auVar22._16_4_ | (uint)!bVar4 * auVar26._16_4_;
    bVar4 = (bool)((byte)(uVar20 >> 5) & 1);
    auVar23._20_4_ = (uint)bVar4 * auVar22._20_4_ | (uint)!bVar4 * auVar26._20_4_;
    bVar4 = (bool)((byte)(uVar20 >> 6) & 1);
    auVar23._24_4_ = (uint)bVar4 * auVar22._24_4_ | (uint)!bVar4 * auVar26._24_4_;
    bVar4 = (bool)((byte)(uVar20 >> 7) & 1);
    auVar23._28_4_ = (uint)bVar4 * auVar22._28_4_ | (uint)!bVar4 * auVar26._28_4_;
    auVar23._32_4_ = (uint)(bVar9 & 1) * auVar22._32_4_ | (uint)!(bool)(bVar9 & 1) * auVar26._32_4_;
    bVar4 = (bool)(bVar9 >> 1 & 1);
    auVar23._36_4_ = (uint)bVar4 * auVar22._36_4_ | (uint)!bVar4 * auVar26._36_4_;
    bVar4 = (bool)(bVar9 >> 2 & 1);
    auVar23._40_4_ = (uint)bVar4 * auVar22._40_4_ | (uint)!bVar4 * auVar26._40_4_;
    bVar4 = (bool)(bVar9 >> 3 & 1);
    auVar23._44_4_ = (uint)bVar4 * auVar22._44_4_ | (uint)!bVar4 * auVar26._44_4_;
    bVar4 = (bool)(bVar9 >> 4 & 1);
    auVar23._48_4_ = (uint)bVar4 * auVar22._48_4_ | (uint)!bVar4 * auVar26._48_4_;
    bVar4 = (bool)(bVar9 >> 5 & 1);
    auVar23._52_4_ = (uint)bVar4 * auVar22._52_4_ | (uint)!bVar4 * auVar26._52_4_;
    bVar4 = (bool)(bVar9 >> 6 & 1);
    auVar23._56_4_ = (uint)bVar4 * auVar22._56_4_ | (uint)!bVar4 * auVar26._56_4_;
    auVar23._60_4_ =
         (uint)(bVar9 >> 7) * auVar22._60_4_ | (uint)!(bool)(bVar9 >> 7) * auVar26._60_4_;
    auVar21 = vextracti64x4_avx512f(auVar23,1);
    auVar22 = vpaddd_avx512f(auVar23,ZEXT3264(auVar21));
    auVar5 = vpaddd_avx(auVar22._0_16_,auVar22._16_16_);
    auVar6 = vpshufd_avx(auVar5,0xee);
    auVar5 = vpaddd_avx(auVar5,auVar6);
    auVar6 = vpshufd_avx(auVar5,0x55);
    auVar5 = vpaddd_avx(auVar5,auVar6);
    uVar11 = (uint64_t)auVar5._0_4_;
  }
  auVar5 = vcvtusi2sd_avx512f(in_XMM7,uVar11);
  __return_storage_ptr__->frame_size = uVar11;
  __return_storage_ptr__->frame_mask = uVar11 - 1;
  auVar22._0_8_ = log2(auVar5._0_8_);
  auVar22._8_56_ = extraout_var;
  uVar11 = vcvttsd2usi_avx512f(auVar22._0_16_);
  __return_storage_ptr__->frame_log2 = uVar11;
  std::vector<dec_entry_msb,_std::allocator<dec_entry_msb>_>::resize
            (&__return_storage_ptr__->table,__return_storage_ptr__->frame_size);
  puVar2 = (__return_storage_ptr__->nfreqs).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar12 = (long)(__return_storage_ptr__->nfreqs).
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish - (long)puVar2 >> 2;
  lVar14 = 0;
  iVar15 = 0;
  do {
    uVar1 = puVar2[lVar14];
    uVar19 = 0;
    if ((ulong)uVar1 != 0) {
      uVar19 = (uint)lVar14;
      iVar10 = uVar19 * 0x10000 + -0x2000000;
      if (0x300 < uVar19) {
        iVar10 = uVar19 << 0x18;
      }
      iVar18 = (0x300 < uVar19 | 0xfffffffe) << 0x1e;
      iVar16 = uVar19 * 0x100 + -0x10000;
      if (0x200 < uVar19) {
        iVar16 = iVar10;
      }
      pdVar3 = (__return_storage_ptr__->table).
               super__Vector_base<dec_entry_msb,_std::allocator<dec_entry_msb>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (0x200 >= uVar19) {
        iVar18 = 0x40000000;
      }
      uVar17 = iVar16 + iVar18;
      if (uVar19 < 0x101) {
        uVar17 = uVar19;
      }
      uVar13 = 0;
      do {
        uVar19 = iVar15 + (uint32_t)uVar13;
        pdVar3[uVar19].freq = uVar1;
        pdVar3[uVar19].mapped_num = uVar17;
        pdVar3[uVar19].offset = (uint32_t)uVar13;
        uVar13 = uVar13 + 1;
      } while (uVar1 != uVar13);
      uVar19 = puVar2[lVar14];
    }
    iVar15 = iVar15 + uVar19;
    lVar14 = lVar14 + 1;
  } while (lVar14 != lVar12 + (ulong)(lVar12 == 0));
  __return_storage_ptr__->lower_bound = __return_storage_ptr__->frame_size << 4;
  return __return_storage_ptr__;
}

Assistant:

static ans_msb_decode load(const uint8_t* in_u8)
    {
        ans_msb_decode model;
        model.nfreqs = ans_load_interp(in_u8);
        model.frame_size = std::accumulate(
            std::begin(model.nfreqs), std::end(model.nfreqs), 0);
        model.frame_mask = model.frame_size - 1;
        model.frame_log2 = log2(model.frame_size);
        model.table.resize(model.frame_size);
        auto max_sym = model.nfreqs.size() - 1;
        uint64_t tmp = constants::K * constants::RADIX;
        uint32_t cur_base = 0;
        for (size_t sym = 0; sym <= max_sym; sym++) {
            auto cur_freq = model.nfreqs[sym];
            for (uint32_t k = 0; k < cur_freq; k++) {
                uint32_t except_bytes = ans_msb_exception_bytes(sym);
                model.table[cur_base + k].freq = cur_freq;
                model.table[cur_base + k].mapped_num
                    = ans_msb_undo_mapping(sym) + (except_bytes << 30);
                model.table[cur_base + k].offset = k;
            }
            cur_base += model.nfreqs[sym];
        }
        model.lower_bound = constants::K * model.frame_size;
        return model;
    }